

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O2

void __thiscall
amrex::FaceLinear::interp_face
          (FaceLinear *this,FArrayBox *crse,int crse_comp,FArrayBox *fine,int fine_comp,int ncomp,
          Box *fine_region,IntVect *ratio,IArrayBox *solve_mask,Geometry *param_9,Geometry *param_10
          ,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_11,int param_12,RunOn runon)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  double *pdVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  uint uVar33;
  int iVar34;
  long lVar35;
  double *pdVar36;
  int iVar37;
  long lVar38;
  double *pdVar39;
  int j;
  uint uVar40;
  ulong uVar41;
  ulong uVar42;
  double *pdVar43;
  long lVar44;
  long lVar45;
  double *pdVar46;
  double *pdVar47;
  double dVar48;
  double *local_1d8;
  double *local_1a0;
  long local_198;
  long local_168;
  double *local_140;
  int local_12c;
  int local_128;
  int local_124;
  double *local_118;
  int local_d4;
  long local_c8;
  double *local_c0;
  long local_90;
  double *local_70;
  
  pdVar19 = (fine->super_BaseFab<double>).dptr;
  iVar1 = (fine->super_BaseFab<double>).domain.smallend.vect[0];
  lVar21 = (long)iVar1;
  iVar23 = (fine->super_BaseFab<double>).domain.smallend.vect[1];
  lVar45 = (long)iVar23;
  iVar37 = (fine->super_BaseFab<double>).domain.smallend.vect[2];
  lVar38 = (long)iVar37;
  lVar25 = (long)(((fine->super_BaseFab<double>).domain.bigend.vect[0] - iVar1) + 1);
  lVar22 = (long)(((fine->super_BaseFab<double>).domain.bigend.vect[1] - iVar23) + 1);
  lVar29 = lVar22 * lVar25;
  lVar44 = (long)(((fine->super_BaseFab<double>).domain.bigend.vect[2] - iVar37) + 1);
  lVar26 = lVar29 * lVar44;
  lVar30 = (long)fine_comp;
  lVar16 = lVar26 * lVar30;
  iVar23 = (crse->super_BaseFab<double>).domain.smallend.vect[0];
  lVar31 = (long)(((crse->super_BaseFab<double>).domain.bigend.vect[0] - iVar23) + 1);
  iVar34 = (crse->super_BaseFab<double>).domain.smallend.vect[1];
  lVar35 = (((crse->super_BaseFab<double>).domain.bigend.vect[1] - iVar34) + 1) * lVar31;
  iVar2 = (crse->super_BaseFab<double>).domain.smallend.vect[2];
  lVar27 = (((crse->super_BaseFab<double>).domain.bigend.vect[2] - iVar2) + 1) * lVar35;
  lVar18 = crse_comp * lVar27;
  piVar10 = (solve_mask->super_BaseFab<int>).dptr;
  if (piVar10 == (int *)0x0) {
    local_c8 = 0;
    iVar4 = 1;
    iVar3 = 1;
    iVar5 = 1;
    local_90 = 0;
    local_168 = 0;
  }
  else {
    iVar3 = (solve_mask->super_BaseFab<int>).domain.smallend.vect[0];
    iVar4 = (solve_mask->super_BaseFab<int>).domain.smallend.vect[1];
    iVar5 = (solve_mask->super_BaseFab<int>).domain.smallend.vect[2];
    local_168 = (long)(((solve_mask->super_BaseFab<int>).domain.bigend.vect[0] - iVar3) + 1);
    local_90 = (((solve_mask->super_BaseFab<int>).domain.bigend.vect[1] - iVar4) + 1) * local_168;
    local_c8 = (((solve_mask->super_BaseFab<int>).domain.bigend.vect[2] - iVar5) + 1) * local_90;
  }
  pdVar43 = (crse->super_BaseFab<double>).dptr;
  uVar15 = (fine_region->btype).itype;
  if ((uVar15 & 1) == 0) {
    iVar6 = (fine_region->bigend).vect[0];
    uVar28 = 0;
    if (0 < ncomp) {
      uVar28 = (ulong)(uint)ncomp;
    }
    iVar7 = ratio->vect[0];
    iVar8 = ratio->vect[1];
    iVar9 = ratio->vect[2];
    uVar40 = (fine_region->smallend).vect[0];
    local_12c = (fine_region->smallend).vect[1];
    local_128 = (fine_region->smallend).vect[2];
    local_d4 = (fine_region->bigend).vect[1];
    local_124 = (fine_region->bigend).vect[2];
    if ((uVar15 & 2) == 0) {
      for (uVar14 = 0; uVar14 != uVar28; uVar14 = uVar14 + 1) {
        for (uVar17 = (long)local_128; (long)uVar17 <= (long)local_124; uVar17 = uVar17 + 1) {
          uVar12 = (uint)uVar17;
          for (uVar32 = (long)local_12c; (long)uVar32 <= (long)local_d4; uVar32 = uVar32 + 1) {
            if ((int)uVar40 <= iVar6) {
              uVar13 = (uint)uVar32;
              uVar41 = (long)(int)uVar40;
              do {
                uVar33 = uVar12;
                if (((iVar9 != 1) && (uVar33 = (int)uVar12 >> 2, iVar9 != 4)) &&
                   (uVar33 = (int)uVar12 >> 1, iVar9 != 2)) {
                  if ((long)uVar17 < 0) {
                    uVar33 = ~((int)~uVar12 / iVar9);
                  }
                  else {
                    uVar33 = (uint)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 |
                                          uVar17 & 0xffffffff) / (long)iVar9);
                  }
                }
                if (uVar33 * iVar9 == uVar12) {
                  uVar20 = (uint)uVar41;
                  if (iVar7 != 1) {
                    if (iVar7 == 4) {
                      if ((long)uVar41 < 0) {
                        uVar20 = (int)uVar20 >> 2;
                      }
                      else {
                        uVar20 = uVar20 >> 2;
                      }
                    }
                    else if (iVar7 == 2) {
                      if ((long)uVar41 < 0) {
                        uVar20 = (int)uVar20 >> 1;
                      }
                      else {
                        uVar20 = uVar20 >> 1;
                      }
                    }
                    else if ((long)uVar41 < 0) {
                      uVar20 = ~((int)~uVar20 / iVar7);
                    }
                    else {
                      uVar20 = (uint)((long)((ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 |
                                            uVar41 & 0xffffffff) / (long)iVar7);
                    }
                  }
                  uVar11 = uVar13;
                  if (((iVar8 != 1) && (uVar11 = (int)uVar13 >> 2, iVar8 != 4)) &&
                     (uVar11 = (int)uVar13 >> 1, iVar8 != 2)) {
                    if ((long)uVar32 < 0) {
                      uVar11 = ~((int)~uVar13 / iVar8);
                    }
                    else {
                      uVar11 = (uint)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 |
                                            uVar32 & 0xffffffff) / (long)iVar8);
                    }
                  }
                  if ((piVar10 == (int *)0x0) ||
                     (piVar10[(int)(uVar11 - iVar4) * local_168 +
                              (long)(int)(uVar20 - iVar3) +
                              (int)(uVar33 - iVar5) * local_90 + uVar14 * local_c8] != 0)) {
                    pdVar19[lVar16 + uVar14 * lVar26 +
                                     (uVar17 - lVar38) * lVar29 +
                                     (uVar32 - lVar45) * lVar25 + (uVar41 - lVar21)] =
                         pdVar43[lVar18 + (int)(uVar11 - iVar34) * lVar31 +
                                          (long)(int)(uVar20 - iVar23) +
                                          (int)(uVar33 - iVar2) * lVar35 + uVar14 * lVar27];
                  }
                }
                uVar41 = uVar41 + 1;
              } while ((int)uVar41 != iVar6 + 1);
            }
          }
        }
      }
    }
    else {
      for (uVar14 = 0; uVar14 != uVar28; uVar14 = uVar14 + 1) {
        for (uVar17 = (long)local_128; (long)uVar17 <= (long)local_124; uVar17 = uVar17 + 1) {
          uVar12 = (uint)uVar17;
          for (uVar32 = (long)local_12c; (long)uVar32 <= (long)local_d4; uVar32 = uVar32 + 1) {
            if ((int)uVar40 <= iVar6) {
              uVar13 = (uint)uVar32;
              uVar41 = (long)(int)uVar40;
              do {
                uVar33 = uVar13;
                if (((iVar8 != 1) && (uVar33 = (int)uVar13 >> 2, iVar8 != 4)) &&
                   (uVar33 = (int)uVar13 >> 1, iVar8 != 2)) {
                  if ((long)uVar32 < 0) {
                    uVar33 = ~((int)~uVar13 / iVar8);
                  }
                  else {
                    uVar33 = (uint)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 |
                                          uVar32 & 0xffffffff) / (long)iVar8);
                  }
                }
                if (uVar33 * iVar8 == uVar13) {
                  uVar20 = (uint)uVar41;
                  if (iVar7 != 1) {
                    if (iVar7 == 4) {
                      if ((long)uVar41 < 0) {
                        uVar20 = (int)uVar20 >> 2;
                      }
                      else {
                        uVar20 = uVar20 >> 2;
                      }
                    }
                    else if (iVar7 == 2) {
                      if ((long)uVar41 < 0) {
                        uVar20 = (int)uVar20 >> 1;
                      }
                      else {
                        uVar20 = uVar20 >> 1;
                      }
                    }
                    else if ((long)uVar41 < 0) {
                      uVar20 = ~((int)~uVar20 / iVar7);
                    }
                    else {
                      uVar20 = (uint)((long)((ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 |
                                            uVar41 & 0xffffffff) / (long)iVar7);
                    }
                  }
                  uVar11 = uVar12;
                  if (((iVar9 != 1) && (uVar11 = (int)uVar12 >> 2, iVar9 != 4)) &&
                     (uVar11 = (int)uVar12 >> 1, iVar9 != 2)) {
                    if ((long)uVar17 < 0) {
                      uVar11 = ~((int)~uVar12 / iVar9);
                    }
                    else {
                      uVar11 = (uint)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 |
                                            uVar17 & 0xffffffff) / (long)iVar9);
                    }
                  }
                  if ((piVar10 == (int *)0x0) ||
                     (piVar10[(int)(uVar33 - iVar4) * local_168 +
                              (long)(int)(uVar20 - iVar3) +
                              (int)(uVar11 - iVar5) * local_90 + uVar14 * local_c8] != 0)) {
                    pdVar19[lVar16 + uVar14 * lVar26 +
                                     (uVar17 - lVar38) * lVar29 +
                                     (uVar32 - lVar45) * lVar25 + (uVar41 - lVar21)] =
                         pdVar43[lVar18 + (int)(uVar33 - iVar34) * lVar31 +
                                          (long)(int)(uVar20 - iVar23) +
                                          (int)(uVar11 - iVar2) * lVar35 + uVar14 * lVar27];
                  }
                }
                uVar41 = uVar41 + 1;
              } while ((int)uVar41 != iVar6 + 1);
            }
          }
        }
      }
    }
  }
  else {
    iVar7 = ratio->vect[0];
    iVar8 = ratio->vect[1];
    uVar40 = (fine_region->smallend).vect[0];
    local_12c = (fine_region->smallend).vect[1];
    local_128 = (fine_region->smallend).vect[2];
    iVar6 = (fine_region->bigend).vect[0];
    local_d4 = (fine_region->bigend).vect[1];
    local_124 = (fine_region->bigend).vect[2];
    uVar28 = 0;
    if (0 < ncomp) {
      uVar28 = (ulong)(uint)ncomp;
    }
    local_70 = (double *)
               ((((long)local_128 * 8 + lVar30 * lVar44 * 8 + lVar38 * -8) * lVar22 +
                 (long)local_12c * 8 + lVar45 * -8) * lVar25 + (long)(int)uVar40 * 8 + lVar21 * -8 +
               (long)pdVar19);
    iVar9 = ratio->vect[2];
    for (uVar14 = 0; uVar14 != uVar28; uVar14 = uVar14 + 1) {
      local_118 = local_70;
      for (uVar17 = (long)local_128; (long)uVar17 <= (long)local_124; uVar17 = uVar17 + 1) {
        uVar12 = (uint)uVar17;
        local_140 = local_118;
        for (uVar32 = (long)local_12c; (long)uVar32 <= (long)local_d4; uVar32 = uVar32 + 1) {
          if ((int)uVar40 <= iVar6) {
            uVar33 = (uint)uVar32;
            pdVar39 = local_140;
            uVar41 = (long)(int)uVar40;
            uVar13 = ~uVar40;
            do {
              uVar20 = (uint)uVar41;
              if (iVar7 == 4) {
                if ((long)uVar41 < 0) {
                  uVar11 = (int)uVar20 >> 2;
                }
                else {
                  uVar11 = uVar20 >> 2;
                }
              }
              else if (iVar7 == 2) {
                if ((long)uVar41 < 0) {
                  uVar11 = (int)uVar20 >> 1;
                }
                else {
                  uVar11 = uVar20 >> 1;
                }
              }
              else {
                uVar11 = uVar20;
                if (iVar7 != 1) {
                  if ((long)uVar41 < 0) {
                    uVar11 = ~((int)uVar13 / iVar7);
                  }
                  else {
                    uVar11 = (uint)((long)((ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 |
                                          uVar41 & 0xffffffff) / (long)iVar7);
                  }
                }
              }
              if (uVar20 == uVar11 * iVar7) {
                uVar20 = uVar33;
                if (((iVar8 != 1) && (uVar20 = (int)uVar33 >> 2, iVar8 != 4)) &&
                   (uVar20 = (int)uVar33 >> 1, iVar8 != 2)) {
                  if ((long)uVar32 < 0) {
                    uVar20 = ~((int)~uVar33 / iVar8);
                  }
                  else {
                    uVar20 = (uint)((long)((ulong)(uint)((int)uVar33 >> 0x1f) << 0x20 |
                                          uVar32 & 0xffffffff) / (long)iVar8);
                  }
                }
                uVar24 = uVar12;
                if (((iVar9 != 1) && (uVar24 = (int)uVar12 >> 2, iVar9 != 4)) &&
                   (uVar24 = (int)uVar12 >> 1, iVar9 != 2)) {
                  if ((long)uVar17 < 0) {
                    uVar24 = ~((int)~uVar12 / iVar9);
                  }
                  else {
                    uVar24 = (uint)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 |
                                          uVar17 & 0xffffffff) / (long)iVar9);
                  }
                }
                if ((piVar10 == (int *)0x0) ||
                   (piVar10[(int)(uVar20 - iVar4) * local_168 +
                            (long)(int)(uVar11 - iVar3) +
                            (int)(uVar24 - iVar5) * local_90 + uVar14 * local_c8] != 0)) {
                  *pdVar39 = pdVar43[lVar18 + (int)(uVar20 - iVar34) * lVar31 +
                                              (long)(int)(uVar11 - iVar23) +
                                              (int)(uVar24 - iVar2) * lVar35 + uVar14 * lVar27];
                }
              }
              uVar41 = uVar41 + 1;
              pdVar39 = pdVar39 + 1;
              uVar13 = uVar13 - 1;
            } while (iVar6 + 1 != (int)uVar41);
          }
          local_140 = local_140 + lVar25;
        }
        local_118 = local_118 + lVar29;
      }
      local_70 = local_70 + lVar26;
    }
  }
  lVar18 = (long)local_d4;
  lVar27 = (long)local_124;
  if ((uVar15 & 1) == 0) {
    uVar28 = 0;
    if (0 < ncomp) {
      uVar28 = (ulong)(uint)ncomp;
    }
    lVar16 = (long)(int)uVar40;
    uVar14 = (ulong)local_12c;
    uVar17 = (ulong)local_128;
    if ((uVar15 & 2) == 0) {
      iVar1 = ratio->vect[2];
      local_1a0 = (double *)
                  (((uVar17 * 8 + lVar30 * lVar44 * 8 + lVar38 * -8) * lVar22 + uVar14 * 8 +
                   lVar45 * -8) * lVar25 + lVar16 * 8 + lVar21 * -8 + (long)pdVar19);
      local_198 = (uVar14 * 8 + lVar30 * lVar44 * lVar22 * 8 + lVar45 * -8) * lVar25 + lVar16 * 8 +
                  lVar21 * -8 + (long)pdVar19;
      for (uVar32 = 0; uVar41 = uVar17, pdVar19 = local_1a0, uVar32 != uVar28; uVar32 = uVar32 + 1)
      {
        for (; (long)uVar41 <= lVar27; uVar41 = uVar41 + 1) {
          uVar15 = (uint)uVar41;
          pdVar43 = pdVar19;
          lVar16 = local_198;
          for (uVar42 = uVar14; (long)uVar42 <= lVar18; uVar42 = uVar42 + 1) {
            pdVar39 = pdVar43;
            lVar21 = lVar16;
            iVar23 = (iVar6 - uVar40) + 1;
            if ((int)uVar40 <= iVar6) {
              do {
                uVar12 = uVar15;
                if (((iVar1 != 1) && (uVar12 = (int)uVar15 >> 2, iVar1 != 4)) &&
                   (uVar12 = (int)uVar15 >> 1, iVar1 != 2)) {
                  if ((long)uVar41 < 0) {
                    uVar12 = ~((int)~uVar15 / iVar1);
                  }
                  else {
                    uVar12 = (uint)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 |
                                          uVar41 & 0xffffffff) / (long)iVar1);
                  }
                }
                iVar34 = uVar15 - uVar12 * iVar1;
                if (iVar34 != 0) {
                  dVar48 = (double)iVar34 * (1.0 / (double)iVar1);
                  *pdVar39 = (1.0 - dVar48) *
                             *(double *)(lVar21 + (long)(int)(uVar12 * iVar1 - iVar37) * lVar29 * 8)
                             + dVar48 * *(double *)
                                         (lVar21 + (long)(int)((uVar12 + 1) * iVar1 - iVar37) *
                                                   lVar29 * 8);
                }
                pdVar39 = pdVar39 + 1;
                lVar21 = lVar21 + 8;
                iVar23 = iVar23 + -1;
              } while (iVar23 != 0);
            }
            pdVar43 = pdVar43 + lVar25;
            lVar16 = lVar16 + lVar25 * 8;
          }
          pdVar19 = pdVar19 + lVar29;
        }
        local_1a0 = local_1a0 + lVar26;
        local_198 = local_198 + lVar26 * 8;
      }
    }
    else {
      lVar31 = lVar30 * lVar44 * lVar22 * 8 + lVar45 * -8;
      iVar1 = ratio->vect[1];
      pdVar43 = (double *)
                (((uVar17 * 8 + lVar30 * lVar44 * 8 + lVar38 * -8) * lVar22 + uVar14 * 8 +
                 lVar45 * -8) * lVar25 + lVar16 * 8 + lVar21 * -8 + (long)pdVar19);
      pdVar19 = pdVar19 + (((uVar17 - lVar38) * lVar29 + lVar16) - lVar21);
      for (uVar32 = 0; uVar41 = uVar17, pdVar39 = pdVar43, local_1d8 = pdVar19, uVar32 != uVar28;
          uVar32 = uVar32 + 1) {
        for (; uVar42 = uVar14, pdVar36 = pdVar39, (long)uVar41 <= lVar27; uVar41 = uVar41 + 1) {
          for (; (long)uVar42 <= lVar18; uVar42 = uVar42 + 1) {
            if ((int)uVar40 <= iVar6) {
              uVar15 = (uint)uVar42;
              pdVar46 = pdVar36;
              pdVar47 = local_1d8;
              iVar23 = (iVar6 - uVar40) + 1;
              do {
                uVar12 = uVar15;
                if (((iVar1 != 1) && (uVar12 = (int)uVar15 >> 2, iVar1 != 4)) &&
                   (uVar12 = (int)uVar15 >> 1, iVar1 != 2)) {
                  if ((long)uVar42 < 0) {
                    uVar12 = ~((int)~uVar15 / iVar1);
                  }
                  else {
                    uVar12 = (uint)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 |
                                          uVar42 & 0xffffffff) / (long)iVar1);
                  }
                }
                iVar37 = uVar15 - uVar12 * iVar1;
                if (iVar37 != 0) {
                  dVar48 = (double)iVar37 * (1.0 / (double)iVar1);
                  *pdVar46 = (1.0 - dVar48) *
                             *(double *)
                              ((long)pdVar47 + (lVar31 + (long)(int)(uVar12 * iVar1) * 8) * lVar25)
                             + dVar48 * *(double *)
                                         ((long)pdVar47 +
                                         (lVar31 + (long)(int)((uVar12 + 1) * iVar1) * 8) * lVar25);
                }
                pdVar46 = pdVar46 + 1;
                pdVar47 = pdVar47 + 1;
                iVar23 = iVar23 + -1;
              } while (iVar23 != 0);
            }
            pdVar36 = pdVar36 + lVar25;
          }
          pdVar39 = pdVar39 + lVar29;
          local_1d8 = local_1d8 + lVar29;
        }
        pdVar43 = pdVar43 + lVar26;
        pdVar19 = pdVar19 + lVar26;
      }
    }
  }
  else {
    iVar23 = ratio->vect[0];
    uVar28 = (ulong)(uint)ncomp;
    if (ncomp < 1) {
      uVar28 = 0;
    }
    local_c0 = (double *)
               ((long)pdVar19 +
               (((long)local_128 * 8 + lVar30 * lVar44 * 8 + lVar38 * -8) * lVar22 +
                (long)local_12c * 8 + lVar45 * -8) * lVar25 + (long)(int)uVar40 * 8 + lVar21 * -8);
    for (uVar14 = 0; uVar14 != uVar28; uVar14 = uVar14 + 1) {
      pdVar43 = local_c0;
      for (lVar21 = (long)local_128; lVar21 <= lVar27; lVar21 = lVar21 + 1) {
        lVar30 = (lVar21 - lVar38) * lVar29;
        pdVar39 = pdVar43;
        for (lVar22 = (long)local_12c; lVar22 <= lVar18; lVar22 = lVar22 + 1) {
          if ((int)uVar40 <= iVar6) {
            lVar31 = (lVar22 - lVar45) * lVar25;
            uVar17 = (long)(int)uVar40;
            pdVar36 = pdVar39;
            uVar15 = ~uVar40;
            do {
              uVar12 = (uint)uVar17;
              if (iVar23 == 4) {
                if ((long)uVar17 < 0) {
                  uVar13 = (int)uVar12 >> 2;
                }
                else {
                  uVar13 = uVar12 >> 2;
                }
              }
              else if (iVar23 == 2) {
                if ((long)uVar17 < 0) {
                  uVar13 = (int)uVar12 >> 1;
                }
                else {
                  uVar13 = uVar12 >> 1;
                }
              }
              else {
                uVar13 = uVar12;
                if (iVar23 != 1) {
                  if ((long)uVar17 < 0) {
                    uVar13 = ~((int)uVar15 / iVar23);
                  }
                  else {
                    uVar13 = (uint)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 |
                                          uVar17 & 0xffffffff) / (long)iVar23);
                  }
                }
              }
              if (uVar12 != uVar13 * iVar23) {
                dVar48 = (double)(int)(-iVar23 * uVar13 + uVar12) * (1.0 / (double)iVar23);
                *pdVar36 = (1.0 - dVar48) *
                           pdVar19[lVar16 + uVar14 * lVar26 +
                                            lVar30 + lVar31 + (int)(uVar13 * iVar23 - iVar1)] +
                           dVar48 * pdVar19[lVar16 + uVar14 * lVar26 +
                                                     lVar30 + lVar31 + (int)((uVar13 + 1) * iVar23 -
                                                                            iVar1)];
              }
              uVar17 = uVar17 + 1;
              pdVar36 = pdVar36 + 1;
              uVar15 = uVar15 - 1;
            } while (iVar6 + 1 != (int)uVar17);
          }
          pdVar39 = pdVar39 + lVar25;
        }
        pdVar43 = pdVar43 + lVar29;
      }
      local_c0 = local_c0 + lVar26;
    }
  }
  return;
}

Assistant:

void
FaceLinear::interp_face (const FArrayBox&  crse,
                         const int         crse_comp,
                         FArrayBox&        fine,
                         const int         fine_comp,
                         const int         ncomp,
                         const Box&        fine_region,
                         const IntVect&    ratio,
                         const IArrayBox&  solve_mask,
                         const Geometry& /*crse_geom */,
                         const Geometry& /*fine_geom */,
                         Vector<BCRec> const& /*bcr*/,
                         const int         /*bccomp*/,
                         RunOn             runon)
{
    BL_PROFILE("FaceLinear::interp_face()");

    AMREX_ASSERT(AMREX_D_TERM(fine_region.type(0),+fine_region.type(1),+fine_region.type(2)) == 1);

    Array4<Real> const& fine_arr = fine.array(fine_comp);
    Array4<Real const> const& crse_arr = crse.const_array(crse_comp);
    Array4<const int> mask_arr;
    if (solve_mask.isAllocated()) {
        mask_arr = solve_mask.const_array();
    }

    //
    // Fill fine ghost faces with piecewise-constant interpolation of coarse data.
    // Operate only on faces that overlap--ie, only fill the fine faces that make up each
    // coarse face, leave the in-between faces alone.
    // The mask ensures we do not overwrite valid fine cells.
    //
    if (fine_region.type(0) == IndexType::NODE)
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_face_interp_x(i,j,k,n,fine_arr,crse_arr,mask_arr,ratio);
        });
    }
#if (AMREX_SPACEDIM >= 2)
    else if (fine_region.type(1) == IndexType::NODE)
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_face_interp_y(i,j,k,n,fine_arr,crse_arr,mask_arr,ratio);
        });
    }
#if (AMREX_SPACEDIM == 3)
    else
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_face_interp_z(i,j,k,n,fine_arr,crse_arr,mask_arr,ratio);
        });
    }
#endif
#endif

    //
    // Interpolate unfilled grow cells using best data from
    // surrounding faces of valid region, and pc-interpd data
    // on fine faces overlaying coarse edges.
    //
    if (fine_region.type(0) == IndexType::NODE)
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_interp_x(i,j,k,n,fine_arr,ratio);
        });
    }
#if (AMREX_SPACEDIM >= 2)
    else if (fine_region.type(1) == IndexType::NODE)
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_interp_y(i,j,k,n,fine_arr,ratio);
        });
    }
#if (AMREX_SPACEDIM == 3)
    else
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_interp_z(i,j,k,n,fine_arr,ratio);
        });
    }
#endif
#endif
}